

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableSortSpecsSanitize(ImGuiTable *table)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  ImGuiTableColumn *pIVar4;
  ImGuiTableColumn *pIVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  
  uVar3 = table->ColumnsCount;
  if ((long)(int)uVar3 < 1) {
    iVar6 = 0;
    lVar8 = 1;
  }
  else {
    pIVar4 = (table->Columns).Data;
    lVar8 = 0;
    iVar6 = 0;
    uVar9 = 0;
    do {
      if (((&pIVar4->SortOrder)[lVar8] != -1) && ((&pIVar4->IsEnabled)[lVar8] == false)) {
        (&pIVar4->SortOrder)[lVar8] = -1;
      }
      bVar1 = (&pIVar4->SortOrder)[lVar8];
      uVar12 = 1L << (bVar1 & 0x3f);
      if (bVar1 == 0xff) {
        uVar12 = 0;
      }
      uVar9 = uVar9 | uVar12;
      iVar6 = iVar6 + (uint)(bVar1 != 0xff);
      lVar8 = lVar8 + 0x68;
    } while ((long)(int)uVar3 * 0x68 - lVar8 != 0);
    lVar8 = uVar9 + 1;
  }
  if (iVar6 < 2) {
    bVar13 = false;
  }
  else {
    bVar13 = (table->Flags & 0x4000000) == 0;
  }
  if (0 < iVar6 && !(bool)((bVar13 ^ 1U) & 1L << ((byte)iVar6 & 0x3f) == lVar8)) {
    pIVar4 = (table->Columns).Data;
    iVar10 = 0;
    uVar9 = 0;
    do {
      uVar12 = 0xffffffff;
      if (0 < (int)uVar3) {
        lVar8 = 0x56;
        uVar11 = 0;
        do {
          if ((uVar9 >> (uVar11 & 0x3f) & 1) == 0) {
            pIVar5 = (table->Columns).Data;
            cVar2 = *(char *)((long)&pIVar5->Flags + lVar8);
            if ((cVar2 != -1) && (((int)uVar12 == -1 || (cVar2 < pIVar5[(int)uVar12].SortOrder)))) {
              uVar12 = uVar11 & 0xffffffff;
            }
          }
          uVar11 = uVar11 + 1;
          lVar8 = lVar8 + 0x68;
        } while (uVar3 != uVar11);
      }
      pIVar4[(int)uVar12].SortOrder = (ImGuiTableColumnIdx)iVar10;
      if (bVar13) {
        iVar6 = 1;
      }
      if ((bool)(0 < (int)uVar3 & bVar13)) {
        lVar8 = 0;
        do {
          if (uVar12 * 0x68 - lVar8 != 0) {
            (&pIVar4->SortOrder)[lVar8] = -1;
          }
          lVar8 = lVar8 + 0x68;
        } while ((ulong)uVar3 * 0x68 - lVar8 != 0);
        iVar6 = 1;
      }
      uVar9 = uVar9 | 1L << (uVar12 & 0x3f);
      iVar10 = iVar10 + 1;
    } while (!(bool)(iVar6 <= iVar10 | bVar13));
  }
  if (((iVar6 == 0) && (iVar6 = 0, (table->Flags & 0x8000000) == 0)) && (0 < table->ColumnsCount)) {
    lVar8 = 0;
    lVar7 = 0x66;
    iVar6 = 0;
    do {
      pIVar4 = (table->Columns).Data;
      bVar13 = true;
      if ((*(char *)((long)pIVar4 + lVar7 + -0xc) == '\x01') &&
         ((*(byte *)((long)pIVar4 + lVar7 + -0x65) & 2) == 0)) {
        *(undefined1 *)((long)pIVar4 + lVar7 + -0x10) = 0;
        *(byte *)((long)pIVar4 + lVar7 + -1) =
             *(byte *)((long)pIVar4 + lVar7 + -1) & 0xfc |
             *(byte *)((long)&pIVar4->Flags + lVar7) & 3;
        iVar6 = 1;
        bVar13 = false;
      }
      if (!bVar13) break;
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x68;
    } while (lVar8 < table->ColumnsCount);
  }
  table->SortSpecsCount = (ImGuiTableColumnIdx)iVar6;
  return;
}

Assistant:

void ImGui::TableSortSpecsSanitize(ImGuiTable* table)
{
    IM_ASSERT(table->Flags & ImGuiTableFlags_Sortable);

    // Clear SortOrder from hidden column and verify that there's no gap or duplicate.
    int sort_order_count = 0;
    ImU64 sort_order_mask = 0x00;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder != -1 && !column->IsEnabled)
            column->SortOrder = -1;
        if (column->SortOrder == -1)
            continue;
        sort_order_count++;
        sort_order_mask |= ((ImU64)1 << column->SortOrder);
        IM_ASSERT(sort_order_count < (int)sizeof(sort_order_mask) * 8);
    }

    const bool need_fix_linearize = ((ImU64)1 << sort_order_count) != (sort_order_mask + 1);
    const bool need_fix_single_sort_order = (sort_order_count > 1) && !(table->Flags & ImGuiTableFlags_SortMulti);
    if (need_fix_linearize || need_fix_single_sort_order)
    {
        ImU64 fixed_mask = 0x00;
        for (int sort_n = 0; sort_n < sort_order_count; sort_n++)
        {
            // Fix: Rewrite sort order fields if needed so they have no gap or duplicate.
            // (e.g. SortOrder 0 disappeared, SortOrder 1..2 exists --> rewrite then as SortOrder 0..1)
            int column_with_smallest_sort_order = -1;
            for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                if ((fixed_mask & ((ImU64)1 << (ImU64)column_n)) == 0 && table->Columns[column_n].SortOrder != -1)
                    if (column_with_smallest_sort_order == -1 || table->Columns[column_n].SortOrder < table->Columns[column_with_smallest_sort_order].SortOrder)
                        column_with_smallest_sort_order = column_n;
            IM_ASSERT(column_with_smallest_sort_order != -1);
            fixed_mask |= ((ImU64)1 << column_with_smallest_sort_order);
            table->Columns[column_with_smallest_sort_order].SortOrder = (ImGuiTableColumnIdx)sort_n;

            // Fix: Make sure only one column has a SortOrder if ImGuiTableFlags_MultiSortable is not set.
            if (need_fix_single_sort_order)
            {
                sort_order_count = 1;
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                    if (column_n != column_with_smallest_sort_order)
                        table->Columns[column_n].SortOrder = -1;
                break;
            }
        }
    }

    // Fallback default sort order (if no column had the ImGuiTableColumnFlags_DefaultSort flag)
    if (sort_order_count == 0 && !(table->Flags & ImGuiTableFlags_SortTristate))
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if (column->IsEnabled && !(column->Flags & ImGuiTableColumnFlags_NoSort))
            {
                sort_order_count = 1;
                column->SortOrder = 0;
                column->SortDirection = (ImU8)TableGetColumnAvailSortDirection(column, 0);
                break;
            }
        }

    table->SortSpecsCount = (ImGuiTableColumnIdx)sort_order_count;
}